

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeSync.cpp
# Opt level: O3

uint __thiscall
TimeSynchronizer::OnAuthenticatedDatagramTimestamp
          (TimeSynchronizer *this,Counter24 *remoteSendTS24,uint64_t localRecvUsec)

{
  uint uVar1;
  undefined4 in_EAX;
  uint uVar2;
  int iVar3;
  undefined8 uStack_18;
  
  iVar3 = ((uint)(localRecvUsec >> 3) & 0x1fffffff) - remoteSendTS24->Value;
  uStack_18 = CONCAT44(iVar3,in_EAX) & 0xffffffffffffff;
  WindowedMinTS24::Update
            (&this->WindowedMinTS24Deltas,(Counter24 *)((long)&uStack_18 + 4),localRecvUsec,10000000
            );
  Recalculate(this);
  uVar2 = 0;
  if (((this->Synchronized)._M_base._M_i & 1U) != 0) {
    uVar2 = (this->MinimumOneWayDelayUsec).super___atomic_base<unsigned_int>._M_i;
    uVar1 = (this->WindowedMinTS24Deltas).Samples[0].Value.Value;
    if ((uVar1 - iVar3 >> 0x17 & 1) != 0) {
      uVar2 = uVar2 + (iVar3 - uVar1 & 0xffffff) * 8;
    }
  }
  return uVar2;
}

Assistant:

unsigned TimeSynchronizer::OnAuthenticatedDatagramTimestamp(
    Counter24 remoteSendTS24,
    uint64_t localRecvUsec)
{
    const Counter24 localTS24 = (uint32_t)(localRecvUsec >> kTime23LostBits);

    // OWD_i + ClockDelta(L-R)_i = Local Receive Time - Remote Send Time
    const Counter24 deltaTS24 = localTS24 - remoteSendTS24;

    WindowedMinTS24Deltas.Update(deltaTS24, localRecvUsec, kDriftWindowUsec);

    Recalculate();

    // Estimated one-way-delay (OWD) for this datagram in microseconds.
    // This does not include processing time only network delay and perhaps
    // some delays from the Operating System when it is heavily loaded.
    // Set to 0 if trip time is not available
    unsigned networkTripUsec = 0;

    if (IsSynchronized())
    {
        // This is equivalent to the shortest RTT/2 seen so far by any pair of packets,
        // meaning that it is the average of the upstream and downstream OWD.
        networkTripUsec = GetMinimumOneWayDelayUsec();

        // While the OWD is an estimate, the relative delay between that
        // smallest packet pair and the current datagram is actually precise:
        const Counter24 minDeltaTS24 = GetMinDeltaTS24();
        if (deltaTS24 > minDeltaTS24)
        {
            const Counter24 relativeTS24 = deltaTS24 - minDeltaTS24;
            networkTripUsec += relativeTS24.ToUnsigned() << kTime23LostBits;
        }

        // What should happen here is if the delay of each packet varies a lot, then we should
        // get pretty accurate OWD for each packet.  But if the variance is low and the delays
        // for upstream and downstream are asymmetric, then it will underestimate the OWD by
        // half of that asymmetry.  Hopefully this inaccuracy won't cause problems..
    }

    return networkTripUsec;
}